

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbrt.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char **fmt;
  bool bVar4;
  bool bVar5;
  int iVar6;
  LogLevel LVar7;
  int iVar8;
  vector<float,_std::allocator<float>_> *pvVar9;
  vector<int,_std::allocator<int>_> *pvVar10;
  _Any_data *onError;
  ulong uVar11;
  char *pcVar12;
  int iVar13;
  string_view str;
  string_view str_00;
  string_view str_01;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  filenames_00;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  filenames_01;
  undefined8 uStack_1250;
  bool toPly;
  bool format;
  char **argv_local;
  float local_1230;
  allocator<char> local_122b;
  allocator<char> local_122a;
  allocator<char> local_1229;
  allocator<char> local_1228;
  allocator<char> local_1227;
  allocator<char> local_1226;
  allocator<char> local_1225;
  allocator<char> local_1224;
  allocator<char> local_1223;
  allocator<char> local_1222;
  allocator<char> local_1221;
  allocator<char> local_1220;
  allocator<char> local_121f;
  allocator<char> local_121e;
  allocator<char> local_121d;
  allocator<char> local_121c;
  allocator<char> local_121b;
  allocator<char> local_121a;
  allocator<char> local_1219;
  string local_1218;
  optional<std::vector<float,_std::allocator<float>_>_> c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filenames;
  string pixelBounds;
  undefined1 local_1198 [32];
  string pixel;
  _Any_data local_1158;
  code *local_1148;
  code *local_1140;
  string renderCoordSys;
  _Any_data local_1118;
  code *local_1108;
  code *local_1100;
  _Any_data local_10f8;
  code *local_10e8;
  code *local_10e0;
  _Any_data local_10d8;
  code *local_10c8;
  code *local_10c0;
  _Any_data local_10b8;
  code *local_10a8;
  code *local_10a0;
  _Any_data local_1098;
  code *local_1088;
  code *local_1080;
  _Any_data local_1078;
  code *local_1068;
  code *local_1060;
  _Any_data local_1058;
  code *local_1048;
  code *local_1040;
  _Any_data local_1038;
  code *local_1028;
  code *local_1020;
  _Any_data local_1018;
  code *local_1008;
  code *local_1000;
  _Any_data local_ff8;
  code *local_fe8;
  code *local_fe0;
  _Any_data local_fd8;
  code *local_fc8;
  code *local_fc0;
  _Any_data local_fb8;
  code *local_fa8;
  code *local_fa0;
  _Any_data local_f98;
  code *local_f88;
  code *local_f80;
  _Any_data local_f78;
  code *local_f68;
  code *local_f60;
  _Any_data local_f58;
  code *local_f48;
  code *local_f40;
  _Any_data local_f38;
  code *local_f28;
  code *local_f20;
  _Any_data local_f18;
  code *local_f08;
  code *local_f00;
  _Any_data local_ef8;
  code *local_ee8;
  code *local_ee0;
  undefined1 local_ed8 [32];
  _Any_data local_eb8;
  code *local_ea8;
  code *local_ea0;
  _Any_data local_e98;
  code *local_e88;
  code *local_e80;
  _Any_data local_e78;
  code *local_e68;
  code *local_e60;
  string logLevel;
  PBRTOptions options;
  string local_d40;
  string local_d20;
  string local_d00;
  string local_ce0;
  string local_cc0;
  string local_ca0;
  string local_c80;
  string local_c60;
  string local_c40;
  string local_c20;
  string local_c00;
  string local_be0;
  string local_bc0;
  string local_ba0;
  string local_b80;
  string cropWindow;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b40;
  polymorphic_allocator<pbrt::ParsedParameter_*> local_b30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b28;
  undefined1 local_b20 [64];
  undefined1 local_ae0 [48];
  undefined1 local_ab0 [32];
  polymorphic_allocator<pbrt::ParsedParameter_*> local_a90;
  
  options.imageFile._M_dataplus._M_p = (pointer)&options.imageFile.field_2;
  options.mseReferenceImage._M_dataplus._M_p = (pointer)&options.mseReferenceImage.field_2;
  options.mseReferenceOutput._M_dataplus._M_p = (pointer)&options.mseReferenceOutput.field_2;
  filenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  options.super_BasicOptions.nThreads = 0;
  options.super_BasicOptions.seed = 0;
  options.super_BasicOptions.quickRender = false;
  options.super_BasicOptions.quiet = false;
  options.super_BasicOptions.recordPixelStatistics = false;
  options.super_BasicOptions.upgrade = false;
  options.super_BasicOptions.disablePixelJitter = false;
  options.super_BasicOptions.disableWavelengthJitter = false;
  options.super_BasicOptions.forceDiffuse = false;
  options.super_BasicOptions.useGPU = false;
  options.super_BasicOptions.renderingSpace = CameraWorld;
  options.logLevel = Error;
  options.pixelSamples.set = false;
  options.gpuDevice.set = false;
  options.imageFile._M_string_length = 0;
  options.imageFile.field_2._M_local_buf[0] = '\0';
  options.mseReferenceImage._M_string_length = 0;
  options.mseReferenceImage.field_2._M_local_buf[0] = '\0';
  options.mseReferenceOutput._M_string_length = 0;
  options.mseReferenceOutput.field_2._M_local_buf[0] = '\0';
  options.debugStart._M_dataplus._M_p = (pointer)&options.debugStart.field_2;
  options.displayServer._M_dataplus._M_p = (pointer)&options.displayServer.field_2;
  filenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  filenames.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  options.debugStart._M_string_length = 0;
  options.debugStart.field_2._M_local_buf[0] = '\0';
  options.displayServer._M_string_length = 0;
  options.displayServer.field_2._M_local_buf[0] = '\0';
  options.cropWindow.set = false;
  options.pixelBounds.set = false;
  argv_local = argv;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&logLevel,"error",(allocator<char> *)&cropWindow);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&renderCoordSys,"cameraworld",(allocator<char> *)&cropWindow);
  format = false;
  toPly = false;
  argv_local = argv_local + 1;
  while( true ) {
    pcVar12 = *argv_local;
    if (pcVar12 == (char *)0x0) break;
    if (*pcVar12 == '-') {
      cropWindow._M_dataplus._M_p = (pointer)&cropWindow.field_2;
      pixelBounds._M_dataplus._M_p = (pointer)&pixelBounds.field_2;
      pixel._M_dataplus._M_p = (pointer)&pixel.field_2;
      cropWindow._M_string_length = 0;
      pixelBounds._M_string_length = 0;
      pixel._M_string_length = 0;
      cropWindow.field_2._M_local_buf[0] = '\0';
      pixelBounds.field_2._M_local_buf[0] = '\0';
      pixel.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&c,"cropwindow",(allocator<char> *)&local_1218);
      local_e78._M_unused._M_object = (void *)0x0;
      local_e78._8_8_ = 0;
      local_e60 = std::
                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                  ::_M_invoke;
      local_e68 = std::
                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                  ::_M_manager;
      bVar4 = pbrt::ParseArg<std::__cxx11::string*>
                        (&argv_local,(string *)&c,&cropWindow,
                         (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                          *)&local_e78);
      std::_Function_base::~_Function_base((_Function_base *)&local_e78);
      std::__cxx11::string::~string((string *)&c);
      if (!bVar4) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&c,"pixel",(allocator<char> *)&local_1218);
        local_e98._M_unused._M_object = (void *)0x0;
        local_e98._8_8_ = 0;
        local_e80 = std::
                    _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                    ::_M_invoke;
        local_e88 = std::
                    _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                    ::_M_manager;
        bVar4 = pbrt::ParseArg<std::__cxx11::string*>
                          (&argv_local,(string *)&c,&pixel,
                           (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                            *)&local_e98);
        std::_Function_base::~_Function_base((_Function_base *)&local_e98);
        std::__cxx11::string::~string((string *)&c);
        if (bVar4) {
          onError = (_Any_data *)0x2c;
          str_00._M_str = pixel._M_dataplus._M_p;
          str_00._M_len = pixel._M_string_length;
          pbrt::SplitStringToInts
                    ((optional<std::vector<int,_std::allocator<int>_>_> *)&c,str_00,',');
          if (c.set == true) {
            pvVar10 = pstd::optional<std::vector<int,_std::allocator<int>_>_>::value
                                ((optional<std::vector<int,_std::allocator<int>_>_> *)&c);
            onError = (_Any_data *)
                      ((long)(pvVar10->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)(pvVar10->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start);
            if (onError == (_Any_data *)0x8) {
              pvVar10 = pstd::optional<std::vector<int,_std::allocator<int>_>_>::value
                                  ((optional<std::vector<int,_std::allocator<int>_>_> *)&c);
              iVar8 = *(pvVar10->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              pvVar10 = pstd::optional<std::vector<int,_std::allocator<int>_>_>::value
                                  ((optional<std::vector<int,_std::allocator<int>_>_> *)&c);
              iVar1 = (pvVar10->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start[1];
              pvVar10 = pstd::optional<std::vector<int,_std::allocator<int>_>_>::value
                                  ((optional<std::vector<int,_std::allocator<int>_>_> *)&c);
              iVar13 = *(pvVar10->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start;
              pvVar10 = pstd::optional<std::vector<int,_std::allocator<int>_>_>::value
                                  ((optional<std::vector<int,_std::allocator<int>_>_> *)&c);
              iVar13 = iVar13 + 1;
              iVar6 = (pvVar10->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start[1] + 1;
              iVar2 = iVar8;
              if (iVar13 < iVar8) {
                iVar2 = iVar13;
              }
              iVar3 = iVar1;
              if (iVar6 < iVar1) {
                iVar3 = iVar6;
              }
              local_1218._M_dataplus._M_p = (pointer)CONCAT44(iVar3,iVar2);
              if (iVar13 < iVar8) {
                iVar13 = iVar8;
              }
              if (iVar6 < iVar1) {
                iVar6 = iVar1;
              }
              local_1218._M_string_length = CONCAT44(iVar6,iVar13);
              pstd::optional<pbrt::Bounds2<int>_>::operator=
                        (&options.pixelBounds,(Bounds2<int> *)&local_1218);
LAB_002838a4:
              pstd::optional<std::vector<int,_std::allocator<int>_>_>::~optional
                        ((optional<std::vector<int,_std::allocator<int>_>_> *)&c);
              goto LAB_002842e8;
            }
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1218,"Didn\'t find two values after --pixel",
                     (allocator<char> *)local_1198);
LAB_0028463b:
          usage(&local_1218);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&c,"pixelbounds",(allocator<char> *)&local_1218);
          local_eb8._M_unused._M_object = (void *)0x0;
          local_eb8._8_8_ = 0;
          local_ea0 = std::
                      _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                      ::_M_invoke;
          local_ea8 = std::
                      _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                      ::_M_manager;
          bVar4 = pbrt::ParseArg<std::__cxx11::string*>
                            (&argv_local,(string *)&c,&pixelBounds,
                             (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                              *)&local_eb8);
          std::_Function_base::~_Function_base((_Function_base *)&local_eb8);
          std::__cxx11::string::~string((string *)&c);
          if (bVar4) {
            onError = (_Any_data *)0x2c;
            str_01._M_str = pixelBounds._M_dataplus._M_p;
            str_01._M_len = pixelBounds._M_string_length;
            pbrt::SplitStringToInts
                      ((optional<std::vector<int,_std::allocator<int>_>_> *)&c,str_01,',');
            if (c.set == true) {
              pvVar10 = pstd::optional<std::vector<int,_std::allocator<int>_>_>::value
                                  ((optional<std::vector<int,_std::allocator<int>_>_> *)&c);
              onError = (_Any_data *)
                        ((long)(pvVar10->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(pvVar10->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_start);
              if (onError == (_Any_data *)0x10) {
                pvVar10 = pstd::optional<std::vector<int,_std::allocator<int>_>_>::value
                                    ((optional<std::vector<int,_std::allocator<int>_>_> *)&c);
                iVar8 = *(pvVar10->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start;
                pvVar10 = pstd::optional<std::vector<int,_std::allocator<int>_>_>::value
                                    ((optional<std::vector<int,_std::allocator<int>_>_> *)&c);
                iVar1 = (pvVar10->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start[2];
                pvVar10 = pstd::optional<std::vector<int,_std::allocator<int>_>_>::value
                                    ((optional<std::vector<int,_std::allocator<int>_>_> *)&c);
                iVar13 = (pvVar10->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start[1];
                pvVar10 = pstd::optional<std::vector<int,_std::allocator<int>_>_>::value
                                    ((optional<std::vector<int,_std::allocator<int>_>_> *)&c);
                iVar2 = iVar8;
                if (iVar13 < iVar8) {
                  iVar2 = iVar13;
                }
                iVar6 = (pvVar10->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start[3];
                iVar3 = iVar1;
                if (iVar6 < iVar1) {
                  iVar3 = iVar6;
                }
                local_1218._M_dataplus._M_p = (pointer)CONCAT44(iVar3,iVar2);
                if (iVar13 < iVar8) {
                  iVar13 = iVar8;
                }
                if (iVar6 < iVar1) {
                  iVar6 = iVar1;
                }
                local_1218._M_string_length = CONCAT44(iVar6,iVar13);
                pstd::optional<pbrt::Bounds2<int>_>::operator=
                          (&options.pixelBounds,(Bounds2<int> *)&local_1218);
                goto LAB_002838a4;
              }
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1218,"Didn\'t find four integer values after --pixelbounds",
                       (allocator<char> *)local_1198);
            goto LAB_0028463b;
          }
          std::__cxx11::string::string<std::allocator<char>>((string *)&c,"debugstart",&local_1219);
          local_1158._M_unused._M_object = (void *)0x0;
          local_1158._8_8_ = 0;
          local_1140 = std::
                       _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                       ::_M_invoke;
          local_1148 = std::
                       _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                       ::_M_manager;
          bVar4 = pbrt::ParseArg<std::__cxx11::string*>
                            (&argv_local,(string *)&c,&options.debugStart,
                             (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                              *)&local_1158);
          if (bVar4) {
LAB_00283996:
            std::_Function_base::~_Function_base((_Function_base *)&local_1158);
            std::__cxx11::string::~string((string *)&c);
            goto LAB_002842e8;
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1218,"disable-pixel-jitter",&local_121a);
          local_1118._M_unused._M_object = (void *)0x0;
          local_1118._8_8_ = 0;
          local_1100 = std::
                       _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                       ::_M_invoke;
          local_1108 = std::
                       _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                       ::_M_manager;
          bVar4 = pbrt::ParseArg<bool*>
                            (&argv_local,&local_1218,&options.super_BasicOptions.disablePixelJitter,
                             (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                              *)&local_1118);
          if (bVar4) {
            std::_Function_base::~_Function_base((_Function_base *)&local_1118);
            std::__cxx11::string::~string((string *)&local_1218);
            goto LAB_00283996;
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_1198,"disable-wavelength-jitter",&local_121b);
          local_ef8._M_unused._M_object = (void *)0x0;
          local_ef8._8_8_ = 0;
          local_ee0 = std::
                      _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                      ::_M_invoke;
          local_ee8 = std::
                      _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                      ::_M_manager;
          onError = &local_ef8;
          bVar4 = pbrt::ParseArg<bool*>
                            (&argv_local,(string *)local_1198,
                             &options.super_BasicOptions.disableWavelengthJitter,
                             (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                              *)onError);
          bVar5 = true;
          if (!bVar4) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_ed8,"display-server",&local_121c);
            local_f18._M_unused._M_object = (void *)0x0;
            local_f18._8_8_ = 0;
            local_f00 = std::
                        _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                        ::_M_invoke;
            local_f08 = std::
                        _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                        ::_M_manager;
            onError = &local_f18;
            bVar4 = pbrt::ParseArg<std::__cxx11::string*>
                              (&argv_local,(string *)local_ed8,&options.displayServer,
                               (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                *)onError);
            bVar5 = true;
            if (!bVar4) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_b80,"force-diffuse",&local_121d);
              local_f38._M_unused._M_object = (void *)0x0;
              local_f38._8_8_ = 0;
              local_f20 = std::
                          _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                          ::_M_invoke;
              local_f28 = std::
                          _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                          ::_M_manager;
              onError = &local_f38;
              bVar4 = pbrt::ParseArg<bool*>
                                (&argv_local,&local_b80,&options.super_BasicOptions.forceDiffuse,
                                 (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                  *)onError);
              bVar5 = true;
              if (!bVar4) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_ba0,"format",&local_121e);
                local_f58._M_unused._M_object = (void *)0x0;
                local_f58._8_8_ = 0;
                local_f40 = std::
                            _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                            ::_M_invoke;
                local_f48 = std::
                            _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                            ::_M_manager;
                onError = &local_f58;
                bVar4 = pbrt::ParseArg<bool*>
                                  (&argv_local,&local_ba0,&format,
                                   (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                    *)onError);
                bVar5 = true;
                if (!bVar4) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_bc0,"log-level",&local_121f);
                  local_f78._M_unused._M_object = (void *)0x0;
                  local_f78._8_8_ = 0;
                  local_f60 = std::
                              _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                              ::_M_invoke;
                  local_f68 = std::
                              _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                              ::_M_manager;
                  onError = &local_f78;
                  bVar4 = pbrt::ParseArg<std::__cxx11::string*>
                                    (&argv_local,&local_bc0,&logLevel,
                                     (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                      *)onError);
                  bVar5 = true;
                  if (!bVar4) {
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_be0,"mse-reference-image",&local_1220);
                    local_f98._M_unused._M_object = (void *)0x0;
                    local_f98._8_8_ = 0;
                    local_f80 = std::
                                _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                                ::_M_invoke;
                    local_f88 = std::
                                _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                                ::_M_manager;
                    onError = &local_f98;
                    bVar4 = pbrt::ParseArg<std::__cxx11::string*>
                                      (&argv_local,&local_be0,&options.mseReferenceImage,
                                       (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                        *)onError);
                    bVar5 = true;
                    if (!bVar4) {
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_c00,"mse-reference-out",&local_1221);
                      local_fb8._M_unused._M_object = (void *)0x0;
                      local_fb8._8_8_ = 0;
                      local_fa0 = std::
                                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                                  ::_M_invoke;
                      local_fa8 = std::
                                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                                  ::_M_manager;
                      onError = &local_fb8;
                      bVar4 = pbrt::ParseArg<std::__cxx11::string*>
                                        (&argv_local,&local_c00,&options.mseReferenceOutput,
                                         (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                          *)onError);
                      bVar5 = true;
                      if (!bVar4) {
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_c20,"nthreads",&local_1222);
                        local_fd8._M_unused._M_object = (void *)0x0;
                        local_fd8._8_8_ = 0;
                        local_fc0 = std::
                                    _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                                    ::_M_invoke;
                        local_fc8 = std::
                                    _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                                    ::_M_manager;
                        onError = &local_fd8;
                        bVar4 = pbrt::ParseArg<int*>
                                          (&argv_local,&local_c20,(int *)&options,
                                           (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                            *)onError);
                        bVar5 = true;
                        if (!bVar4) {
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&local_c40,"outfile",&local_1223);
                          local_ff8._M_unused._M_object = (void *)0x0;
                          local_ff8._8_8_ = 0;
                          local_fe0 = std::
                                      _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                                      ::_M_invoke;
                          local_fe8 = std::
                                      _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                                      ::_M_manager;
                          onError = &local_ff8;
                          bVar4 = pbrt::ParseArg<std::__cxx11::string*>
                                            (&argv_local,&local_c40,&options.imageFile,
                                             (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                              *)onError);
                          bVar5 = true;
                          if (!bVar4) {
                            std::__cxx11::string::string<std::allocator<char>>
                                      ((string *)&local_c60,"pixelstats",&local_1224);
                            local_1018._M_unused._M_object = (void *)0x0;
                            local_1018._8_8_ = 0;
                            local_1000 = std::
                                         _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                                         ::_M_invoke;
                            local_1008 = std::
                                         _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                                         ::_M_manager;
                            onError = &local_1018;
                            bVar4 = pbrt::ParseArg<bool*>
                                              (&argv_local,&local_c60,
                                               &options.super_BasicOptions.recordPixelStatistics,
                                               (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                                *)onError);
                            bVar5 = true;
                            if (!bVar4) {
                              std::__cxx11::string::string<std::allocator<char>>
                                        ((string *)&local_c80,"quick",&local_1225);
                              local_1038._M_unused._M_object = (void *)0x0;
                              local_1038._8_8_ = 0;
                              local_1020 = std::
                                           _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                                           ::_M_invoke;
                              local_1028 = std::
                                           _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                                           ::_M_manager;
                              onError = &local_1038;
                              bVar4 = pbrt::ParseArg<bool*>
                                                (&argv_local,&local_c80,
                                                 &options.super_BasicOptions.quickRender,
                                                 (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                                  *)onError);
                              bVar5 = true;
                              if (!bVar4) {
                                std::__cxx11::string::string<std::allocator<char>>
                                          ((string *)&local_ca0,"quiet",&local_1226);
                                local_1058._M_unused._M_object = (void *)0x0;
                                local_1058._8_8_ = 0;
                                local_1040 = std::
                                             _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                                             ::_M_invoke;
                                local_1048 = std::
                                             _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                                             ::_M_manager;
                                onError = &local_1058;
                                bVar4 = pbrt::ParseArg<bool*>
                                                  (&argv_local,&local_ca0,
                                                   &options.super_BasicOptions.quiet,
                                                   (
                                                  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                                  *)onError);
                                bVar5 = true;
                                if (!bVar4) {
                                  std::__cxx11::string::string<std::allocator<char>>
                                            ((string *)&local_cc0,"render-coord-sys",&local_1227);
                                  local_1078._M_unused._M_object = (void *)0x0;
                                  local_1078._8_8_ = 0;
                                  local_1060 = std::
                                               _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                                               ::_M_invoke;
                                  local_1068 = std::
                                               _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                                               ::_M_manager;
                                  onError = &local_1078;
                                  bVar4 = pbrt::ParseArg<std::__cxx11::string*>
                                                    (&argv_local,&local_cc0,&renderCoordSys,
                                                     (
                                                  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                                  *)onError);
                                  bVar5 = true;
                                  if (!bVar4) {
                                    std::__cxx11::string::string<std::allocator<char>>
                                              ((string *)&local_ce0,"seed",&local_1228);
                                    local_1098._M_unused._M_object = (void *)0x0;
                                    local_1098._8_8_ = 0;
                                    local_1080 = std::
                                                 _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                                                 ::_M_invoke;
                                    local_1088 = std::
                                                 _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                                                 ::_M_manager;
                                    onError = &local_1098;
                                    bVar4 = pbrt::ParseArg<int*>
                                                      (&argv_local,&local_ce0,
                                                       &options.super_BasicOptions.seed,
                                                       (
                                                  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                                  *)onError);
                                    bVar5 = true;
                                    if (!bVar4) {
                                      std::__cxx11::string::string<std::allocator<char>>
                                                ((string *)&local_d00,"spp",&local_1229);
                                      local_10b8._M_unused._M_object = (void *)0x0;
                                      local_10b8._8_8_ = 0;
                                      local_10a0 = std::
                                                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                                                  ::_M_invoke;
                                      local_10a8 = std::
                                                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                                                  ::_M_manager;
                                      onError = &local_10b8;
                                      bVar4 = pbrt::ParseArg<pstd::optional<int>*>
                                                        (&argv_local,&local_d00,
                                                         &options.pixelSamples,
                                                         (
                                                  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                                  *)onError);
                                      bVar5 = true;
                                      if (!bVar4) {
                                        std::__cxx11::string::string<std::allocator<char>>
                                                  ((string *)&local_d20,"toply",&local_122a);
                                        local_10d8._M_unused._M_object = (void *)0x0;
                                        local_10d8._8_8_ = 0;
                                        local_10c0 = std::
                                                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                                                  ::_M_invoke;
                                        local_10c8 = std::
                                                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                                                  ::_M_manager;
                                        onError = &local_10d8;
                                        bVar4 = pbrt::ParseArg<bool*>
                                                          (&argv_local,&local_d20,&toPly,
                                                           (
                                                  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                                  *)onError);
                                        bVar5 = true;
                                        if (!bVar4) {
                                          std::__cxx11::string::string<std::allocator<char>>
                                                    ((string *)&local_d40,"upgrade",&local_122b);
                                          local_10f8._M_unused._M_object = (void *)0x0;
                                          local_10f8._8_8_ = 0;
                                          local_10e0 = std::
                                                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                                                  ::_M_invoke;
                                          local_10e8 = std::
                                                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                                                  ::_M_manager;
                                          onError = &local_10f8;
                                          bVar5 = pbrt::ParseArg<bool*>
                                                            (&argv_local,&local_d40,
                                                             &options.super_BasicOptions.upgrade,
                                                             (
                                                  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                                  *)onError);
                                          std::_Function_base::~_Function_base
                                                    ((_Function_base *)&local_10f8);
                                          std::__cxx11::string::~string((string *)&local_d40);
                                        }
                                        std::_Function_base::~_Function_base
                                                  ((_Function_base *)&local_10d8);
                                        std::__cxx11::string::~string((string *)&local_d20);
                                      }
                                      std::_Function_base::~_Function_base
                                                ((_Function_base *)&local_10b8);
                                      std::__cxx11::string::~string((string *)&local_d00);
                                    }
                                    std::_Function_base::~_Function_base
                                              ((_Function_base *)&local_1098);
                                    std::__cxx11::string::~string((string *)&local_ce0);
                                  }
                                  std::_Function_base::~_Function_base
                                            ((_Function_base *)&local_1078);
                                  std::__cxx11::string::~string((string *)&local_cc0);
                                }
                                std::_Function_base::~_Function_base((_Function_base *)&local_1058);
                                std::__cxx11::string::~string((string *)&local_ca0);
                              }
                              std::_Function_base::~_Function_base((_Function_base *)&local_1038);
                              std::__cxx11::string::~string((string *)&local_c80);
                            }
                            std::_Function_base::~_Function_base((_Function_base *)&local_1018);
                            std::__cxx11::string::~string((string *)&local_c60);
                          }
                          std::_Function_base::~_Function_base((_Function_base *)&local_ff8);
                          std::__cxx11::string::~string((string *)&local_c40);
                        }
                        std::_Function_base::~_Function_base((_Function_base *)&local_fd8);
                        std::__cxx11::string::~string((string *)&local_c20);
                      }
                      std::_Function_base::~_Function_base((_Function_base *)&local_fb8);
                      std::__cxx11::string::~string((string *)&local_c00);
                    }
                    std::_Function_base::~_Function_base((_Function_base *)&local_f98);
                    std::__cxx11::string::~string((string *)&local_be0);
                  }
                  std::_Function_base::~_Function_base((_Function_base *)&local_f78);
                  std::__cxx11::string::~string((string *)&local_bc0);
                }
                std::_Function_base::~_Function_base((_Function_base *)&local_f58);
                std::__cxx11::string::~string((string *)&local_ba0);
              }
              std::_Function_base::~_Function_base((_Function_base *)&local_f38);
              std::__cxx11::string::~string((string *)&local_b80);
            }
            std::_Function_base::~_Function_base((_Function_base *)&local_f18);
            std::__cxx11::string::~string((string *)local_ed8);
          }
          std::_Function_base::~_Function_base((_Function_base *)&local_ef8);
          std::__cxx11::string::~string((string *)local_1198);
          std::_Function_base::~_Function_base((_Function_base *)&local_1118);
          std::__cxx11::string::~string((string *)&local_1218);
          std::_Function_base::~_Function_base((_Function_base *)&local_1158);
          std::__cxx11::string::~string((string *)&c);
          if (bVar5 != false) goto LAB_002842e8;
        }
        fmt = argv_local;
        pcVar12 = *argv_local;
        iVar8 = strcmp(pcVar12,"--help");
        if (((iVar8 == 0) || (iVar8 = strcmp(pcVar12,"-help"), iVar8 == 0)) ||
           ((*pcVar12 == '-' && ((pcVar12[1] == 'h' && (pcVar12[2] == '\0')))))) {
          c.optionalValue.__align =
               (anon_struct_8_0_00000001_for___align)((long)&c.optionalValue + 0x10);
          c.optionalValue._8_8_ = 0;
          c.optionalValue.__data[0x10] = '\0';
        }
        else {
          pbrt::StringPrintf<char*&>
                    ((string *)&c,(pbrt *)"argument \"%s\" unknown",(char *)fmt,(char **)onError);
        }
        usage((string *)&c);
        goto LAB_0028468e;
      }
      onError = (_Any_data *)0x2c;
      str._M_str = cropWindow._M_dataplus._M_p;
      str._M_len = cropWindow._M_string_length;
      pbrt::SplitStringToFloats(&c,str,',');
      if (c.set != true) {
LAB_002845ec:
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1218,"Didn\'t find four values after --cropwindow",
                   (allocator<char> *)local_1198);
        goto LAB_0028463b;
      }
      pvVar9 = pstd::optional<std::vector<float,_std::allocator<float>_>_>::value(&c);
      onError = (_Any_data *)
                ((long)(pvVar9->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)(pvVar9->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                      super__Vector_impl_data._M_start);
      if (onError != (_Any_data *)0x10) goto LAB_002845ec;
      pvVar9 = pstd::optional<std::vector<float,_std::allocator<float>_>_>::value(&c);
      local_1230 = *(pvVar9->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                    super__Vector_impl_data._M_start;
      pvVar9 = pstd::optional<std::vector<float,_std::allocator<float>_>_>::value(&c);
      local_1198._4_4_ =
           (pvVar9->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start[2];
      local_1198._0_4_ = local_1230;
      pvVar9 = pstd::optional<std::vector<float,_std::allocator<float>_>_>::value(&c);
      local_1230 = (pvVar9->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                   super__Vector_impl_data._M_start[1];
      pvVar9 = pstd::optional<std::vector<float,_std::allocator<float>_>_>::value(&c);
      local_ed8._4_4_ =
           (pvVar9->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start[3];
      local_ed8._0_4_ = local_1230;
      pbrt::Bounds2<float>::Bounds2
                ((Bounds2<float> *)&local_1218,(Point2<float> *)local_1198,
                 (Point2<float> *)local_ed8);
      pstd::optional<pbrt::Bounds2<float>_>::operator=
                (&options.cropWindow,(Bounds2<float> *)&local_1218);
      pstd::optional<std::vector<float,_std::allocator<float>_>_>::~optional(&c);
LAB_002842e8:
      std::__cxx11::string::~string((string *)&pixel);
      std::__cxx11::string::~string((string *)&pixelBounds);
      std::__cxx11::string::~string((string *)&cropWindow);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cropWindow,pcVar12,(allocator<char> *)&pixelBounds);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&filenames,
                 &cropWindow);
      std::__cxx11::string::~string((string *)&cropWindow);
      argv_local = argv_local + 1;
    }
  }
  if ((((options.super_BasicOptions.quiet == false) && (format == false)) && (toPly == false)) &&
     (options.super_BasicOptions.upgrade == false)) {
    printf("pbrt version 4 (built %s at %s)\n","May  2 2025","23:43:04");
    puts("Copyright (c)1998-2020 Matt Pharr, Wenzel Jakob, and Greg Humphreys.");
    puts(
        "The source code to pbrt (but *not* the book contents) is covered by the Apache 2.0 License."
        );
    puts("See the file LICENSE.txt for the conditions of the license.");
    fflush(_stdout);
  }
  bVar4 = std::operator==(&renderCoordSys,"camera");
  uStack_1250 = 0;
  if (!bVar4) {
    bVar4 = std::operator==(&renderCoordSys,"cameraworld");
    if (bVar4) {
      uStack_1250 = 1;
    }
    else {
      bVar4 = std::operator==(&renderCoordSys,"world");
      if (!bVar4) {
        pbrt::ErrorExit<std::__cxx11::string&>
                  ("%s: unknown rendering coordinate system.",&renderCoordSys);
      }
      uStack_1250 = 2;
    }
  }
  options.super_BasicOptions.renderingSpace = (RenderingCoordinateSystem)uStack_1250;
  if (options.mseReferenceImage._M_string_length == 0) {
    if (options.mseReferenceOutput._M_string_length != 0) {
LAB_0028468e:
      pcVar12 = "Must provide MSE reference image via --mse-reference-image";
      goto LAB_00284695;
    }
  }
  else if (options.mseReferenceOutput._M_string_length == 0) {
    pcVar12 = "Must provide MSE reference output filename via --mse-reference-out";
LAB_00284695:
    pbrt::ErrorExit<>(pcVar12);
  }
  LVar7 = pbrt::LogLevelFromString(&logLevel);
  options.logLevel = LVar7;
  pbrt::InitPBRT(&options);
  if (format == true) {
    uVar11 = (ulong)options.super_BasicOptions.upgrade;
  }
  else {
    uVar11 = CONCAT71((int7)((ulong)uStack_1250 >> 8),options.super_BasicOptions.upgrade);
    if (((toPly & 1U) == 0) && ((options.super_BasicOptions._8_8_ & 0x1000000) == 0)) {
      pbrt::ParsedScene::ParsedScene((ParsedScene *)&cropWindow);
      filenames_01.ptr =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)filenames.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)filenames.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5);
      filenames_01.n = uVar11;
      pbrt::ParseFiles((pbrt *)&cropWindow,
                       (SceneRepresentation *)
                       filenames.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,filenames_01);
      if (options.super_BasicOptions.useGPU == true) {
        pbrt::ErrorExit<>("GPU rendering is not supported on this system.");
      }
      pbrt::CPURender((ParsedScene *)&cropWindow);
      if (pbrt::LOGGING_LogLevel < 1) {
        pixelBounds._M_dataplus._M_p = (pointer)pbrt::GetCurrentRSS();
        pbrt::Log<unsigned_long>
                  (Verbose,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp"
                   ,0xf3,"Memory used after post-render cleanup: %s",(unsigned_long *)&pixelBounds);
      }
      pbrt::CleanupPBRT();
      pbrt::ParsedScene::~ParsedScene((ParsedScene *)&cropWindow);
      goto LAB_00284514;
    }
  }
  local_b30.memoryResource = (memory_resource *)&local_b40;
  cropWindow._M_dataplus._M_p = (pointer)&PTR_Scale_030103f8;
  cropWindow._M_string_length = (cropWindow._M_string_length >> 8 & 0xffffff) << 8;
  cropWindow.field_2._M_local_buf[0] = toPly;
  cropWindow.field_2._M_local_buf[1] = (char)uVar11;
  local_b40._M_allocated_capacity._0_4_ = 0;
  local_b40._8_8_ = 0;
  local_b20._0_8_ = (ParsedParameter *)0x0;
  local_b20._32_8_ = local_b20 + 0x10;
  local_ae0._16_8_ = local_ae0;
  local_b20._16_4_ = _S_red;
  local_b20._24_8_ = (ParsedParameter *)0x0;
  local_b20._48_8_ = (ParsedParameter *)0x0;
  local_ae0._0_4_ = _S_red;
  local_ae0._8_8_ = (_Base_ptr)0x0;
  local_ae0._32_8_ = (char *)0x0;
  local_ab0._16_8_ = local_ab0;
  local_ab0._0_4_ = _S_red;
  local_ab0._8_8_ = (_Base_ptr)0x0;
  local_a90.memoryResource = (memory_resource *)0x0;
  filenames_00.ptr =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)filenames.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)filenames.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 5);
  filenames_00.n = local_ab0._16_8_;
  local_b28 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b30.memoryResource;
  local_b20._40_8_ = local_b20._32_8_;
  local_ae0._24_8_ = local_ae0._16_8_;
  local_ab0._24_8_ = local_ab0._16_8_;
  pbrt::ParseFiles((pbrt *)&cropWindow,
                   (SceneRepresentation *)
                   filenames.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,filenames_00);
  pbrt::FormattingScene::~FormattingScene((FormattingScene *)&cropWindow);
LAB_00284514:
  std::__cxx11::string::~string((string *)&renderCoordSys);
  std::__cxx11::string::~string((string *)&logLevel);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&filenames);
  pbrt::PBRTOptions::~PBRTOptions(&options);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
#ifdef NVTX
#ifdef PBRT_IS_WINDOWS
    nvtxNameOsThread(GetCurrentThreadId(), "MAIN_THREAD");
#else
    nvtxNameOsThread(syscall(SYS_gettid), "MAIN_THREAD");
#endif
#endif  // NVTX

    // Declare variables for parsed command line
    PBRTOptions options;
    std::vector<std::string> filenames;
    std::string logLevel = "error";
    std::string renderCoordSys = "cameraworld";
    bool format = false, toPly = false;

    // Process command-line arguments
    ++argv;
    while (*argv != nullptr) {
        if ((*argv)[0] != '-') {
            filenames.push_back(*argv);
            ++argv;
            continue;
        }

        auto onError = [](const std::string &err) {
            usage(err);
            exit(1);
        };

        std::string cropWindow, pixelBounds, pixel;
        if (ParseArg(&argv, "cropwindow", &cropWindow, onError)) {
            pstd::optional<std::vector<Float>> c = SplitStringToFloats(cropWindow, ',');
            if (!c || c->size() != 4) {
                usage("Didn't find four values after --cropwindow");
                return 1;
            }
            options.cropWindow =
                Bounds2f(Point2f((*c)[0], (*c)[2]), Point2f((*c)[1], (*c)[3]));
        } else if (ParseArg(&argv, "pixel", &pixel, onError)) {
            pstd::optional<std::vector<int>> p = SplitStringToInts(pixel, ',');
            if (!p || p->size() != 2) {
                usage("Didn't find two values after --pixel");
                return 1;
            }
            options.pixelBounds =
                Bounds2i(Point2i((*p)[0], (*p)[1]), Point2i((*p)[0] + 1, (*p)[1] + 1));
        } else if (ParseArg(&argv, "pixelbounds", &pixelBounds, onError)) {
            pstd::optional<std::vector<int>> p = SplitStringToInts(pixelBounds, ',');
            if (!p || p->size() != 4) {
                usage("Didn't find four integer values after --pixelbounds");
                return 1;
            }
            options.pixelBounds =
                Bounds2i(Point2i((*p)[0], (*p)[2]), Point2i((*p)[1], (*p)[3]));
        } else if (
#ifdef PBRT_BUILD_GPU_RENDERER
            ParseArg(&argv, "gpu", &options.useGPU, onError) ||
            ParseArg(&argv, "gpu-device", &options.gpuDevice, onError) ||
#endif
            ParseArg(&argv, "debugstart", &options.debugStart, onError) ||
            ParseArg(&argv, "disable-pixel-jitter", &options.disablePixelJitter,
                     onError) ||
            ParseArg(&argv, "disable-wavelength-jitter", &options.disableWavelengthJitter,
                     onError) ||
            ParseArg(&argv, "display-server", &options.displayServer, onError) ||
            ParseArg(&argv, "force-diffuse", &options.forceDiffuse, onError) ||
            ParseArg(&argv, "format", &format, onError) ||
            ParseArg(&argv, "log-level", &logLevel, onError) ||
            ParseArg(&argv, "mse-reference-image", &options.mseReferenceImage, onError) ||
            ParseArg(&argv, "mse-reference-out", &options.mseReferenceOutput, onError) ||
            ParseArg(&argv, "nthreads", &options.nThreads, onError) ||
            ParseArg(&argv, "outfile", &options.imageFile, onError) ||
            ParseArg(&argv, "pixelstats", &options.recordPixelStatistics, onError) ||
            ParseArg(&argv, "quick", &options.quickRender, onError) ||
            ParseArg(&argv, "quiet", &options.quiet, onError) ||
            ParseArg(&argv, "render-coord-sys", &renderCoordSys, onError) ||
            ParseArg(&argv, "seed", &options.seed, onError) ||
            ParseArg(&argv, "spp", &options.pixelSamples, onError) ||
            ParseArg(&argv, "toply", &toPly, onError) ||
            ParseArg(&argv, "upgrade", &options.upgrade, onError)) {
            // success
        } else if ((strcmp(*argv, "--help") == 0) || (strcmp(*argv, "-help") == 0) ||
                   (strcmp(*argv, "-h") == 0)) {
            usage();
            return 0;
        } else {
            usage(StringPrintf("argument \"%s\" unknown", *argv));
            return 1;
        }
    }

    // Print welcome banner
    if (!options.quiet && !format && !toPly && !options.upgrade) {
        printf("pbrt version 4 (built %s at %s)\n", __DATE__, __TIME__);
#ifndef NDEBUG
        LOG_VERBOSE("Running debug build");
        printf("*** DEBUG BUILD ***\n");
#endif  // !NDEBUG
        printf("Copyright (c)1998-2020 Matt Pharr, Wenzel Jakob, and Greg Humphreys.\n");
        printf("The source code to pbrt (but *not* the book contents) is covered "
               "by the Apache 2.0 License.\n");
        printf("See the file LICENSE.txt for the conditions of the license.\n");
        fflush(stdout);
    }

    // Check validity of provided arguments
    if (renderCoordSys == "camera")
        options.renderingSpace = RenderingCoordinateSystem::Camera;
    else if (renderCoordSys == "cameraworld")
        options.renderingSpace = RenderingCoordinateSystem::CameraWorld;
    else if (renderCoordSys == "world")
        options.renderingSpace = RenderingCoordinateSystem::World;
    else
        ErrorExit("%s: unknown rendering coordinate system.", renderCoordSys);

    if (!options.mseReferenceImage.empty() && options.mseReferenceOutput.empty())
        ErrorExit("Must provide MSE reference output filename via "
                  "--mse-reference-out");
    if (!options.mseReferenceOutput.empty() && options.mseReferenceImage.empty())
        ErrorExit("Must provide MSE reference image via --mse-reference-image");

    options.logLevel = LogLevelFromString(logLevel);

    // Initialize pbrt
    InitPBRT(options);

    if (format || toPly || options.upgrade) {
        FormattingScene formattingScene(toPly, options.upgrade);
        ParseFiles(&formattingScene, filenames);
    } else {
        // Parse provided scene description files
        ParsedScene scene;
        ParseFiles(&scene, filenames);

        // Render the scene
        if (options.useGPU)
            GPURender(scene);
        else
            CPURender(scene);

        LOG_VERBOSE("Memory used after post-render cleanup: %s", GetCurrentRSS());
        // Clean up after rendering the scene
        CleanupPBRT();
    }
    return 0;
}